

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase229::run(TestCase229 *this)

{
  StructDataBitCount *this_00;
  Builder reader;
  Builder reader_00;
  Reader reader_01;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Reader reader_02;
  Reader reader_03;
  initializer_list<int> expected;
  initializer_list<int> expected_00;
  initializer_list<int> expected_01;
  bool bVar1;
  Orphan<capnp::AnyStruct> *value;
  Orphan<capnp::AnyList> *value_00;
  void *__buf;
  int __flags;
  char *in_R8;
  undefined8 in_stack_fffffffffffff9e0;
  undefined8 uVar2;
  undefined8 in_stack_fffffffffffff9e8;
  int local_600;
  bool local_5f9;
  undefined1 local_5f8 [7];
  bool _kj_shouldLog_6;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> local_5c0;
  Maybe<capnp::MessageSize> local_580;
  Client local_568;
  undefined1 local_550 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  req;
  Client client;
  Client local_4f8;
  int local_4e4;
  undefined1 local_4e0 [4];
  int callCount;
  WaitScope waitScope;
  EventLoop loop;
  Builder local_478;
  BuilderFor<capnp::List<int,_(capnp::Kind)0>_> local_450;
  bool local_426;
  bool local_425;
  int local_424;
  bool _kj_shouldLog_5;
  undefined4 uStack_420;
  bool _kj_shouldLog_4;
  undefined4 local_41c;
  iterator local_418;
  undefined8 local_410;
  ReaderFor<capnp::AnyList> local_408;
  ReaderFor<capnp::List<int,_(capnp::Kind)0>_> local_3d8;
  undefined1 local_3a8 [8];
  Orphan<capnp::AnyList> orphan_1;
  bool _kj_shouldLog_3;
  BuilderFor<capnp::List<int,_(capnp::Kind)0>_> local_368;
  undefined1 local_340 [8];
  Builder anyList;
  Builder list;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2c8;
  bool local_29a;
  bool local_299;
  undefined1 local_298 [6];
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_268;
  undefined1 local_238 [8];
  Orphan<capnp::AnyStruct> orphan;
  undefined1 local_210 [7];
  bool _kj_shouldLog;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1e0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_1b0;
  undefined1 local_188 [8];
  Builder anyStruct;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase229 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyOthers>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyOthers::Builder::
  initAnyStructFieldAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&anyStruct._builder.dataSize,
             (Builder *)local_128);
  builder_00._builder.capTable = (CapTableBuilder *)local_150;
  builder_00._builder.segment = (SegmentBuilder *)uStack_158;
  builder_00._builder.data = (void *)uStack_148;
  builder_00._builder.pointers = (WirePointer *)local_140;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffff9e0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffff9e0 >> 0x30);
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyStructField
            ((Builder *)local_188,(Builder *)local_128);
  AnyStruct::Builder::as<capnproto_test::capnp::test::TestAllTypes>(&local_1b0,(Builder *)local_188)
  ;
  builder_01._builder.capTable = (CapTableBuilder *)local_1b0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_1b0._builder.capTable;
  builder_01._builder.data = local_1b0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_1b0._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffff9e0;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffff9e0 >> 0x30);
  checkTestMessage(builder_01);
  AnyStruct::Builder::asReader((Reader *)local_210,(Builder *)local_188);
  AnyStruct::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_1e0,(Reader *)local_210);
  reader_02._reader.capTable = (CapTableReader *)local_1e0._reader.data;
  reader_02._reader.segment = (SegmentReader *)local_1e0._reader.capTable;
  reader_02._reader.data = local_1e0._reader.pointers;
  reader_02._reader.pointers = (WirePointer *)local_1e0._reader._32_8_;
  reader_02._reader.dataSize = local_1e0._reader.nestingLimit;
  reader_02._reader.pointerCount = local_1e0._reader._44_2_;
  reader_02._reader._38_2_ = local_1e0._reader._46_2_;
  reader_02._reader._40_8_ = in_stack_fffffffffffff9e8;
  checkTestMessage(reader_02);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyStructField
                    ((Builder *)local_128);
  if (!bVar1) {
    orphan.builder.location._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan.builder.location._7_1_ != false) {
      in_R8 = "failed: expected root.hasAnyStructField()";
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xef,ERROR,"\"failed: expected \" \"root.hasAnyStructField()\"",
                 (char (*) [42])"failed: expected root.hasAnyStructField()");
      orphan.builder.location._7_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::disownAnyStructField
            ((Orphan<capnp::AnyStruct> *)local_238,(Builder *)local_128);
  Orphan<capnp::AnyStruct>::getReader
            ((ReaderFor<capnp::AnyStruct> *)local_298,(Orphan<capnp::AnyStruct> *)local_238);
  AnyStruct::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_268,(Reader *)local_298);
  reader_03._reader.capTable = (CapTableReader *)local_268._reader.data;
  reader_03._reader.segment = (SegmentReader *)local_268._reader.capTable;
  reader_03._reader.data = local_268._reader.pointers;
  reader_03._reader.pointers = (WirePointer *)local_268._reader._32_8_;
  reader_03._reader.dataSize = local_268._reader.nestingLimit;
  reader_03._reader.pointerCount = local_268._reader._44_2_;
  reader_03._reader._38_2_ = local_268._reader._46_2_;
  reader_03._reader._40_8_ = in_stack_fffffffffffff9e8;
  checkTestMessage(reader_03);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyStructField
                    ((Builder *)local_128);
  uVar2 = local_268._reader._40_8_;
  if (bVar1) {
    local_299 = kj::_::Debug::shouldLog(ERROR);
    while (uVar2 = local_268._reader._40_8_, local_299 != false) {
      in_R8 = "failed: expected !(root.hasAnyStructField())";
      kj::_::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xf2,ERROR,"\"failed: expected \" \"!(root.hasAnyStructField())\"",
                 (char (*) [45])"failed: expected !(root.hasAnyStructField())");
      local_299 = false;
    }
  }
  value = kj::mv<capnp::Orphan<capnp::AnyStruct>>((Orphan<capnp::AnyStruct> *)local_238);
  capnproto_test::capnp::test::TestAnyOthers::Builder::adoptAnyStructField
            ((Builder *)local_128,value);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyStructField
                    ((Builder *)local_128);
  if (!bVar1) {
    local_29a = kj::_::Debug::shouldLog(ERROR);
    while (local_29a != false) {
      in_R8 = "failed: expected root.hasAnyStructField()";
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xf5,ERROR,"\"failed: expected \" \"root.hasAnyStructField()\"",
                 (char (*) [42])"failed: expected root.hasAnyStructField()");
      local_29a = false;
    }
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyStructField
            ((Builder *)&list.builder.structDataSize,(Builder *)local_128);
  AnyStruct::Builder::as<capnproto_test::capnp::test::TestAllTypes>
            (&local_2c8,(Builder *)&list.builder.structDataSize);
  builder_02._builder.capTable = (CapTableBuilder *)local_2c8._builder.data;
  builder_02._builder.segment = (SegmentBuilder *)local_2c8._builder.capTable;
  builder_02._builder.data = local_2c8._builder.pointers;
  builder_02._builder.pointers = (WirePointer *)local_2c8._builder._32_8_;
  builder_02._builder.dataSize = (int)uVar2;
  builder_02._builder.pointerCount = SUB82(uVar2,4);
  builder_02._builder._38_2_ = SUB82(uVar2,6);
  checkTestMessage(builder_02);
  Orphan<capnp::AnyStruct>::~Orphan((Orphan<capnp::AnyStruct> *)local_238);
  capnproto_test::capnp::test::TestAnyOthers::Builder::
  initAnyListFieldAs<capnp::List<int,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<int,_(capnp::Kind)0>_> *)&anyList._builder.structDataSize,
             (Builder *)local_128,3);
  List<int,_(capnp::Kind)0>::Builder::set((Builder *)&anyList._builder.structDataSize,0,0x7b);
  List<int,_(capnp::Kind)0>::Builder::set((Builder *)&anyList._builder.structDataSize,1,0x1c8);
  List<int,_(capnp::Kind)0>::Builder::set((Builder *)&anyList._builder.structDataSize,2,0x315);
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyListField
            ((Builder *)local_340,(Builder *)local_128);
  AnyList::Builder::as<capnp::List<int,(capnp::Kind)0>>(&local_368,(Builder *)local_340);
  orphan_1.builder.location._4_4_ = 0x7b;
  expected_01._M_len = 3;
  expected_01._M_array = (iterator)((long)&orphan_1.builder.location + 4);
  reader.builder.capTable = local_368.builder.capTable;
  reader.builder.segment = local_368.builder.segment;
  reader.builder.ptr = local_368.builder.ptr;
  reader.builder.elementCount = local_368.builder.elementCount;
  reader.builder.step = local_368.builder.step;
  reader.builder.structDataSize = local_368.builder.structDataSize;
  reader.builder.structPointerCount = local_368.builder.structPointerCount;
  reader.builder.elementSize = local_368.builder.elementSize;
  reader.builder._39_1_ = local_368.builder._39_1_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader,expected_01);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyListField((Builder *)local_128)
  ;
  if (!bVar1) {
    orphan_1.builder.location._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan_1.builder.location._3_1_ != false) {
      in_R8 = "failed: expected root.hasAnyListField()";
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x102,ERROR,"\"failed: expected \" \"root.hasAnyListField()\"",
                 (char (*) [40])"failed: expected root.hasAnyListField()");
      orphan_1.builder.location._3_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::disownAnyListField
            ((Orphan<capnp::AnyList> *)local_3a8,(Builder *)local_128);
  Orphan<capnp::AnyList>::getReader(&local_408,(Orphan<capnp::AnyList> *)local_3a8);
  AnyList::Reader::as<capnp::List<int,(capnp::Kind)0>>(&local_3d8,&local_408);
  local_424 = 0x7b;
  uStack_420 = 0x1c8;
  local_41c = 0x315;
  local_418 = &local_424;
  local_410 = 3;
  expected_00._M_len = 3;
  expected_00._M_array = local_418;
  reader_01.reader.capTable = local_3d8.reader.capTable;
  reader_01.reader.segment = local_3d8.reader.segment;
  reader_01.reader.ptr = local_3d8.reader.ptr;
  reader_01.reader.elementCount = local_3d8.reader.elementCount;
  reader_01.reader.step = local_3d8.reader.step;
  reader_01.reader.structDataSize = local_3d8.reader.structDataSize;
  reader_01.reader.structPointerCount = local_3d8.reader.structPointerCount;
  reader_01.reader.elementSize = local_3d8.reader.elementSize;
  reader_01.reader._39_1_ = local_3d8.reader._39_1_;
  reader_01.reader.nestingLimit = local_3d8.reader.nestingLimit;
  reader_01.reader._44_4_ = local_3d8.reader._44_4_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_01,expected_00);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyListField((Builder *)local_128)
  ;
  if (bVar1) {
    local_425 = kj::_::Debug::shouldLog(ERROR);
    while (local_425 != false) {
      in_R8 = "failed: expected !(root.hasAnyListField())";
      kj::_::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x105,ERROR,"\"failed: expected \" \"!(root.hasAnyListField())\"",
                 (char (*) [43])"failed: expected !(root.hasAnyListField())");
      local_425 = false;
    }
  }
  value_00 = kj::mv<capnp::Orphan<capnp::AnyList>>((Orphan<capnp::AnyList> *)local_3a8);
  capnproto_test::capnp::test::TestAnyOthers::Builder::adoptAnyListField
            ((Builder *)local_128,value_00);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyListField((Builder *)local_128)
  ;
  __flags = (int)in_R8;
  if (!bVar1) {
    local_426 = kj::_::Debug::shouldLog(ERROR);
    while (__flags = (int)in_R8, local_426 != false) {
      in_R8 = "failed: expected root.hasAnyListField()";
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x108,ERROR,"\"failed: expected \" \"root.hasAnyListField()\"",
                 (char (*) [40])"failed: expected root.hasAnyListField()");
      local_426 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyListField
            (&local_478,(Builder *)local_128);
  AnyList::Builder::as<capnp::List<int,(capnp::Kind)0>>(&local_450,&local_478);
  loop.daemons.ptr._4_4_ = 0x7b;
  expected._M_len = 3;
  expected._M_array = (iterator)((long)&loop.daemons.ptr + 4);
  reader_00.builder.capTable = local_450.builder.capTable;
  reader_00.builder.segment = local_450.builder.segment;
  reader_00.builder.ptr = local_450.builder.ptr;
  reader_00.builder.elementCount = local_450.builder.elementCount;
  reader_00.builder.step = local_450.builder.step;
  reader_00.builder.structDataSize = local_450.builder.structDataSize;
  reader_00.builder.structPointerCount = local_450.builder.structPointerCount;
  reader_00.builder.elementSize = local_450.builder.elementSize;
  reader_00.builder._39_1_ = local_450.builder._39_1_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_00,expected);
  Orphan<capnp::AnyList>::~Orphan((Orphan<capnp::AnyList> *)local_3a8);
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_4e0,(EventLoop *)&waitScope.busyPollInterval);
  local_4e4 = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&client.hook.ptr,&local_4e4);
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&local_4f8,(Own<capnp::_::TestInterfaceImpl> *)&client.hook.ptr);
  capnproto_test::capnp::test::TestAnyOthers::Builder::setCapabilityField
            ((Builder *)local_128,&local_4f8);
  Capability::Client::~Client(&local_4f8);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own((Own<capnp::_::TestInterfaceImpl> *)&client.hook.ptr);
  capnproto_test::capnp::test::TestAnyOthers::Builder::getCapabilityField((Builder *)&req.hook.ptr);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
            (&local_568,(Client *)&req.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_580,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_550,&local_568,&local_580);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_580);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_568);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_550,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_550,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_5f8,(int)local_550,__buf,local_450.builder._32_8_,__flags);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_5c0,local_5f8);
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response(&local_5c0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)local_5f8);
  if (local_4e4 != 1) {
    local_5f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5f9 != false) {
      local_600 = 1;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0x118,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
                 (char (*) [36])"failed: expected (1) == (callCount)",&local_600,&local_4e4);
      local_5f9 = false;
    }
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_550);
  Capability::Client::~Client((Client *)&req.hook.ptr);
  kj::WaitScope::~WaitScope((WaitScope *)local_4e0);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Any, AnyStructListCapInSchema) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyOthers>();

  {
    initTestMessage(root.initAnyStructFieldAs<TestAllTypes>());
    AnyStruct::Builder anyStruct = root.getAnyStructField();
    checkTestMessage(anyStruct.as<TestAllTypes>());
    checkTestMessage(anyStruct.asReader().as<TestAllTypes>());

    EXPECT_TRUE(root.hasAnyStructField());
    auto orphan = root.disownAnyStructField();
    checkTestMessage(orphan.getReader().as<TestAllTypes>());
    EXPECT_FALSE(root.hasAnyStructField());

    root.adoptAnyStructField(kj::mv(orphan));
    EXPECT_TRUE(root.hasAnyStructField());
    checkTestMessage(root.getAnyStructField().as<TestAllTypes>());
  }

  {
    List<int>::Builder list = root.initAnyListFieldAs<List<int>>(3);
    list.set(0, 123);
    list.set(1, 456);
    list.set(2, 789);

    AnyList::Builder anyList = root.getAnyListField();
    checkList(anyList.as<List<int>>(), {123, 456, 789});

    EXPECT_TRUE(root.hasAnyListField());
    auto orphan = root.disownAnyListField();
    checkList(orphan.getReader().as<List<int>>(), {123, 456, 789});
    EXPECT_FALSE(root.hasAnyListField());

    root.adoptAnyListField(kj::mv(orphan));
    EXPECT_TRUE(root.hasAnyListField());
    checkList(root.getAnyListField().as<List<int>>(), {123, 456, 789});
  }

#if !CAPNP_LITE
  // This portion of the test relies on a Client, not present in lite-mode.
  {
    kj::EventLoop loop;
    kj::WaitScope waitScope(loop);
    int callCount = 0;
    root.setCapabilityField(kj::heap<TestInterfaceImpl>(callCount));
    Capability::Client client = root.getCapabilityField();
    auto req = client.castAs<test::TestInterface>().fooRequest();
    req.setI(123);
    req.setJ(true);
    req.send().wait(waitScope);
    EXPECT_EQ(1, callCount);
  }
#endif
}